

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Light_Button.cxx
# Opt level: O0

void __thiscall Fl_Light_Button::draw(Fl_Light_Button *this)

{
  char cVar1;
  Fl_Boxtype FVar2;
  Fl_Color FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Fl_Widget *pFVar12;
  Fl_Color local_cc;
  Fl_Color local_c8;
  Fl_Color local_70;
  Fl_Color local_6c;
  Fl_Boxtype local_64;
  int local_58;
  int xx;
  int ww;
  int hh;
  int tdy;
  int tdx;
  int tW;
  int n;
  int ty;
  int d2;
  int d1;
  int tw;
  int tx;
  int lx;
  int dy;
  int dx;
  int bx;
  int W;
  Fl_Color col;
  Fl_Light_Button *this_local;
  
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  if (FVar2 != FL_NO_BOX) {
    pFVar12 = Fl::pushed();
    if ((Fl_Widget *)this == pFVar12) {
      FVar2 = Fl_Widget::box((Fl_Widget *)this);
      local_64 = fl_down(FVar2);
    }
    else {
      local_64 = Fl_Widget::box((Fl_Widget *)this);
    }
    FVar3 = Fl_Widget::color((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,local_64,FVar3);
  }
  cVar1 = Fl_Button::value(&this->super_Fl_Button);
  if (cVar1 == '\0') {
    local_70 = Fl_Widget::color((Fl_Widget *)this);
  }
  else {
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar4 == 0) {
      FVar3 = Fl_Widget::selection_color((Fl_Widget *)this);
      local_6c = fl_inactive(FVar3);
    }
    else {
      local_6c = Fl_Widget::selection_color((Fl_Widget *)this);
    }
    local_70 = local_6c;
  }
  iVar5 = Fl_Widget::labelsize((Fl_Widget *)this);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dx(FVar2);
  iVar6 = iVar4 + 2;
  iVar7 = Fl_Widget::h((Fl_Widget *)this);
  iVar7 = (iVar7 - iVar5) / 2;
  FVar2 = Fl_Button::down_box(&this->super_Fl_Button);
  if (FVar2 == FL_NO_BOX) {
    iVar8 = Fl_Widget::h((Fl_Widget *)this);
    iVar8 = iVar8 + iVar7 * -2 + -2;
    iVar5 = iVar5 / 2 + 1;
    iVar9 = Fl_Widget::w((Fl_Widget *)this);
    local_58 = iVar6;
    if (iVar9 < iVar5 + iVar6 * 2) {
      iVar9 = Fl_Widget::w((Fl_Widget *)this);
      local_58 = (iVar9 - iVar5) / 2;
    }
    iVar9 = Fl::is_scheme("plastic");
    if (iVar9 == 0) {
      iVar9 = Fl_Widget::x((Fl_Widget *)this);
      iVar10 = Fl_Widget::y((Fl_Widget *)this);
      Fl_Widget::draw_box((Fl_Widget *)this,FL_THIN_DOWN_BOX,iVar9 + local_58,iVar10 + iVar7 + 1,
                          iVar5,iVar8,local_70);
    }
    else {
      iVar9 = Fl_Widget::active_r((Fl_Widget *)this);
      if (iVar9 == 0) {
        FVar3 = Fl_Widget::selection_color((Fl_Widget *)this);
        local_c8 = fl_inactive(FVar3);
      }
      else {
        local_c8 = Fl_Widget::selection_color((Fl_Widget *)this);
      }
      cVar1 = Fl_Button::value(&this->super_Fl_Button);
      if (cVar1 == '\0') {
        local_cc = fl_color_average(local_c8,0x38,0.5);
      }
      else {
        local_cc = local_c8;
      }
      fl_color(local_cc);
      iVar9 = Fl_Widget::x((Fl_Widget *)this);
      iVar10 = Fl_Widget::y((Fl_Widget *)this);
      fl_pie(iVar9 + local_58,iVar10 + iVar7 + 1,iVar5,iVar8,0.0,360.0);
    }
    goto LAB_001fc88b;
  }
  FVar2 = Fl_Button::down_box(&this->super_Fl_Button);
  if (1 < FVar2 - FL_UP_BOX) {
    if (FVar2 - _FL_ROUND_UP_BOX < 2) {
      FVar2 = Fl_Button::down_box(&this->super_Fl_Button);
      iVar8 = Fl_Widget::x((Fl_Widget *)this);
      iVar9 = Fl_Widget::y((Fl_Widget *)this);
      Fl_Widget::draw_box((Fl_Widget *)this,FVar2,iVar8 + iVar6,iVar9 + iVar7,iVar5,iVar5,7);
      cVar1 = Fl_Button::value(&this->super_Fl_Button);
      if (cVar1 != '\0') {
        FVar2 = Fl_Button::down_box(&this->super_Fl_Button);
        iVar8 = Fl::box_dw(FVar2);
        iVar8 = (iVar5 - iVar8) / 2;
        tdy = iVar8 + 1;
        if ((iVar5 - tdy & 1U) != 0) {
          tdy = iVar8 + 2;
        }
        iVar8 = iVar6 + (iVar5 - tdy) / 2;
        iVar7 = iVar7 + (iVar5 - tdy) / 2;
        iVar9 = Fl::is_scheme("gtk+");
        if (iVar9 == 0) {
          fl_color(local_70);
        }
        else {
          fl_color(0xf);
          iVar9 = Fl_Widget::x((Fl_Widget *)this);
          iVar10 = Fl_Widget::y((Fl_Widget *)this);
          fl_pie(iVar9 + iVar8 + -1,iVar10 + iVar7 + -1,tdy + 2,tdy + 2,0.0,360.0);
          FVar3 = fl_color_average(0xff,0xf,0.2);
          fl_color(FVar3);
          tdy = tdy + -1;
        }
        if (tdy - 1U < 2) {
          iVar9 = Fl_Widget::x((Fl_Widget *)this);
          iVar10 = Fl_Widget::y((Fl_Widget *)this);
          fl_rectf(iVar9 + iVar8,iVar10 + iVar7,tdy,tdy);
        }
        else if (tdy - 3U < 3) {
          iVar9 = Fl_Widget::x((Fl_Widget *)this);
          iVar10 = Fl_Widget::y((Fl_Widget *)this);
          fl_rectf(iVar9 + iVar8 + 1,iVar10 + iVar7,tdy + -2,tdy);
          iVar9 = Fl_Widget::x((Fl_Widget *)this);
          iVar10 = Fl_Widget::y((Fl_Widget *)this);
          fl_rectf(iVar9 + iVar8,iVar10 + iVar7 + 1,tdy,tdy + -2);
        }
        else if (tdy == 6) {
          iVar9 = Fl_Widget::x((Fl_Widget *)this);
          iVar10 = Fl_Widget::y((Fl_Widget *)this);
          fl_rectf(iVar9 + iVar8 + 2,iVar10 + iVar7,2,6);
          iVar9 = Fl_Widget::x((Fl_Widget *)this);
          iVar10 = Fl_Widget::y((Fl_Widget *)this);
          fl_rectf(iVar9 + iVar8 + 1,iVar10 + iVar7 + 1,4,4);
          iVar9 = Fl_Widget::x((Fl_Widget *)this);
          iVar10 = Fl_Widget::y((Fl_Widget *)this);
          fl_rectf(iVar9 + iVar8,iVar10 + iVar7 + 2,6,2);
        }
        else {
          iVar9 = Fl_Widget::x((Fl_Widget *)this);
          iVar10 = Fl_Widget::y((Fl_Widget *)this);
          fl_pie(iVar9 + iVar8,iVar10 + iVar7,tdy,tdy,0.0,360.0);
        }
        iVar9 = Fl::is_scheme("gtk+");
        if (iVar9 != 0) {
          FVar3 = fl_color_average(0xff,0xf,0.5);
          fl_color(FVar3);
          iVar9 = Fl_Widget::x((Fl_Widget *)this);
          iVar10 = Fl_Widget::y((Fl_Widget *)this);
          fl_arc(iVar9 + iVar8,iVar10 + iVar7,tdy + 1,tdy + 1,60.0,180.0);
        }
      }
      goto LAB_001fc88b;
    }
    if (FVar2 != _FL_PLASTIC_UP_BOX && FVar2 != _FL_PLASTIC_DOWN_BOX) {
      FVar2 = Fl_Button::down_box(&this->super_Fl_Button);
      iVar8 = Fl_Widget::x((Fl_Widget *)this);
      iVar9 = Fl_Widget::y((Fl_Widget *)this);
      Fl_Widget::draw_box((Fl_Widget *)this,FVar2,iVar8 + iVar6,iVar9 + iVar7,iVar5,iVar5,local_70);
      goto LAB_001fc88b;
    }
  }
  FVar2 = Fl_Button::down_box(&this->super_Fl_Button);
  iVar8 = Fl_Widget::x((Fl_Widget *)this);
  iVar9 = Fl_Widget::y((Fl_Widget *)this);
  Fl_Widget::draw_box((Fl_Widget *)this,FVar2,iVar8 + iVar6,iVar9 + iVar7,iVar5,iVar5,7);
  cVar1 = Fl_Button::value(&this->super_Fl_Button);
  if (cVar1 != '\0') {
    iVar8 = Fl::is_scheme("gtk+");
    if (iVar8 == 0) {
      fl_color(local_70);
    }
    else {
      fl_color(0xf);
    }
    iVar8 = Fl_Widget::x((Fl_Widget *)this);
    iVar8 = iVar8 + iVar6 + 3;
    iVar9 = iVar5 + -6;
    iVar10 = iVar9 / 3;
    iVar11 = Fl_Widget::y((Fl_Widget *)this);
    tW = ((iVar11 + iVar7 + (iVar5 + (iVar9 - iVar10)) / 2) - iVar10) + -2;
    for (tdx = 0; tdx < 3; tdx = tdx + 1) {
      fl_line(iVar8,tW,iVar8 + iVar10,tW + iVar10);
      fl_line(iVar8 + iVar10,tW + iVar10,iVar8 + iVar9 + -1,((tW + iVar10) - (iVar9 - iVar10)) + 1);
      tW = tW + 1;
    }
  }
LAB_001fc88b:
  tw = iVar6 + iVar5 + 2;
  iVar6 = Fl_Widget::x((Fl_Widget *)this);
  iVar7 = Fl_Widget::y((Fl_Widget *)this);
  iVar5 = Fl_Widget::w((Fl_Widget *)this);
  iVar8 = Fl_Widget::h((Fl_Widget *)this);
  Fl_Widget::draw_label((Fl_Widget *)this,iVar6 + tw,iVar7,(iVar5 - tw) - iVar4,iVar8);
  pFVar12 = Fl::focus();
  if (pFVar12 == (Fl_Widget *)this) {
    Fl_Widget::draw_focus((Fl_Widget *)this);
  }
  return;
}

Assistant:

void Fl_Light_Button::draw() {
  if (box()) draw_box(this==Fl::pushed() ? fl_down(box()) : box(), color());
  Fl_Color col = value() ? (active_r() ? selection_color() :
                            fl_inactive(selection_color())) : color();

  int W  = labelsize();
  int bx = Fl::box_dx(box());	// box frame width
  int dx = bx + 2;		// relative position of check mark etc.
  int dy = (h() - W) / 2;	// neg. offset o.k. for vertical centering
  int lx = 0;			// relative label position (STR #3237)

  if (down_box()) {
    // draw other down_box() styles:
    switch (down_box()) {
      case FL_DOWN_BOX :
      case FL_UP_BOX :
      case _FL_PLASTIC_DOWN_BOX :
      case _FL_PLASTIC_UP_BOX :
        // Check box...
        draw_box(down_box(), x()+dx, y()+dy, W, W, FL_BACKGROUND2_COLOR);
	if (value()) {
	  if (Fl::is_scheme("gtk+")) {
	    fl_color(FL_SELECTION_COLOR);
	  } else {
	    fl_color(col);
	  }
	  int tx = x() + dx + 3;
	  int tw = W - 6;
	  int d1 = tw/3;
	  int d2 = tw-d1;
	  int ty = y() + dy + (W+d2)/2-d1-2;
	  for (int n = 0; n < 3; n++, ty++) {
	    fl_line(tx, ty, tx+d1, ty+d1);
	    fl_line(tx+d1, ty+d1, tx+tw-1, ty+d1-d2+1);
	  }
	}
        break;
      case _FL_ROUND_DOWN_BOX :
      case _FL_ROUND_UP_BOX :
        // Radio button...
        draw_box(down_box(), x()+dx, y()+dy, W, W, FL_BACKGROUND2_COLOR);
	if (value()) {
	  int tW = (W - Fl::box_dw(down_box())) / 2 + 1;
	  if ((W - tW) & 1) tW++; // Make sure difference is even to center
	  int tdx = dx + (W - tW) / 2;
	  int tdy = dy + (W - tW) / 2;

	  if (Fl::is_scheme("gtk+")) {
	    fl_color(FL_SELECTION_COLOR);
	    tW --;
	    fl_pie(x() + tdx - 1, y() + tdy - 1, tW + 3, tW + 3, 0.0, 360.0);
	    fl_color(fl_color_average(FL_WHITE, FL_SELECTION_COLOR, 0.2f));
	  } else fl_color(col);

	  switch (tW) {
	    // Larger circles draw fine...
	    default :
              fl_pie(x() + tdx, y() + tdy, tW, tW, 0.0, 360.0);
	      break;

            // Small circles don't draw well on many systems...
	    case 6 :
	      fl_rectf(x() + tdx + 2, y() + tdy, tW - 4, tW);
	      fl_rectf(x() + tdx + 1, y() + tdy + 1, tW - 2, tW - 2);
	      fl_rectf(x() + tdx, y() + tdy + 2, tW, tW - 4);
	      break;

	    case 5 :
	    case 4 :
	    case 3 :
	      fl_rectf(x() + tdx + 1, y() + tdy, tW - 2, tW);
	      fl_rectf(x() + tdx, y() + tdy + 1, tW, tW - 2);
	      break;

	    case 2 :
	    case 1 :
	      fl_rectf(x() + tdx, y() + tdy, tW, tW);
	      break;
	  }

	  if (Fl::is_scheme("gtk+")) {
	    fl_color(fl_color_average(FL_WHITE, FL_SELECTION_COLOR, 0.5));
	    fl_arc(x() + tdx, y() + tdy, tW + 1, tW + 1, 60.0, 180.0);
	  }
	}
        break;
      default :
        draw_box(down_box(), x()+dx, y()+dy, W, W, col);
        break;
    }
    lx = dx + W + 2;
  } else {
    // if down_box() is zero, draw light button style:
    int hh = h()-2*dy - 2;
    int ww = W/2+1;
    int xx = dx;
    if (w()<ww+2*xx) xx = (w()-ww)/2;
    if (Fl::is_scheme("plastic")) {
      col = active_r() ? selection_color() : fl_inactive(selection_color());
      fl_color(value() ? col : fl_color_average(col, FL_BLACK, 0.5f));
      fl_pie(x()+xx, y()+dy+1, ww, hh, 0, 360);
    } else {
      draw_box(FL_THIN_DOWN_BOX, x()+xx, y()+dy+1, ww, hh, col);
    }
    lx = dx + ww + 2;
  }
  draw_label(x()+lx, y(), w()-lx-bx, h());
  if (Fl::focus() == this) draw_focus();
}